

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_get_unordered_set_Test::~ObjectTest_basic_get_unordered_set_Test
          (ObjectTest_basic_get_unordered_set_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_unordered_set) {
	object obj;

	EXPECT_TRUE(obj.get<std::unordered_set<bool>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<short>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<int>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<float>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<object>>().empty());
}